

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O2

void chacha20_block(uint32_t *initial_state,uchar *keystream)

{
  long lVar1;
  bool bVar2;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_78 = *(undefined8 *)initial_state;
  uStack_70 = *(undefined8 *)(initial_state + 2);
  local_68 = *(undefined8 *)(initial_state + 4);
  uStack_60 = *(undefined8 *)(initial_state + 6);
  local_58 = *(undefined8 *)(initial_state + 8);
  uStack_50 = *(undefined8 *)(initial_state + 10);
  local_48 = *(undefined8 *)(initial_state + 0xc);
  uStack_40 = *(undefined8 *)(initial_state + 0xe);
  lVar1 = 10;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    chacha20_quarter_round((uint32_t *)&local_78,0,4,8,0xc);
    chacha20_quarter_round((uint32_t *)&local_78,1,5,9,0xd);
    chacha20_quarter_round((uint32_t *)&local_78,2,6,10,0xe);
    chacha20_quarter_round((uint32_t *)&local_78,3,7,0xb,0xf);
    chacha20_quarter_round((uint32_t *)&local_78,0,5,10,0xf);
    chacha20_quarter_round((uint32_t *)&local_78,1,6,0xb,0xc);
    chacha20_quarter_round((uint32_t *)&local_78,2,7,8,0xd);
    chacha20_quarter_round((uint32_t *)&local_78,3,4,9,0xe);
  }
  local_78 = CONCAT44(initial_state[1] + local_78._4_4_,*initial_state + (uint32_t)local_78);
  uStack_70 = CONCAT44(initial_state[3] + uStack_70._4_4_,initial_state[2] + (int)uStack_70);
  local_68 = CONCAT44(initial_state[5] + local_68._4_4_,initial_state[4] + (int)local_68);
  uStack_60 = CONCAT44(initial_state[7] + uStack_60._4_4_,initial_state[6] + (int)uStack_60);
  local_58 = CONCAT44(initial_state[9] + local_58._4_4_,initial_state[8] + (int)local_58);
  uStack_50 = CONCAT44(initial_state[0xb] + uStack_50._4_4_,initial_state[10] + (int)uStack_50);
  local_48 = CONCAT44(initial_state[0xd] + local_48._4_4_,initial_state[0xc] + (int)local_48);
  uStack_40 = CONCAT44(initial_state[0xf] + uStack_40._4_4_,initial_state[0xe] + (int)uStack_40);
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    *(undefined4 *)(keystream + lVar1 * 4) = *(undefined4 *)((long)&local_78 + lVar1 * 4);
  }
  mbedtls_platform_zeroize(&local_78,0x40);
  return;
}

Assistant:

static void chacha20_block( const uint32_t initial_state[16],
                            unsigned char keystream[64] )
{
    uint32_t working_state[16];
    size_t i;

    memcpy( working_state,
            initial_state,
            CHACHA20_BLOCK_SIZE_BYTES );

    for( i = 0U; i < 10U; i++ )
        chacha20_inner_block( working_state );

    working_state[ 0] += initial_state[ 0];
    working_state[ 1] += initial_state[ 1];
    working_state[ 2] += initial_state[ 2];
    working_state[ 3] += initial_state[ 3];
    working_state[ 4] += initial_state[ 4];
    working_state[ 5] += initial_state[ 5];
    working_state[ 6] += initial_state[ 6];
    working_state[ 7] += initial_state[ 7];
    working_state[ 8] += initial_state[ 8];
    working_state[ 9] += initial_state[ 9];
    working_state[10] += initial_state[10];
    working_state[11] += initial_state[11];
    working_state[12] += initial_state[12];
    working_state[13] += initial_state[13];
    working_state[14] += initial_state[14];
    working_state[15] += initial_state[15];

    for( i = 0U; i < 16; i++ )
    {
        size_t offset = i * 4U;

        keystream[offset     ] = (unsigned char)( working_state[i]       );
        keystream[offset + 1U] = (unsigned char)( working_state[i] >>  8 );
        keystream[offset + 2U] = (unsigned char)( working_state[i] >> 16 );
        keystream[offset + 3U] = (unsigned char)( working_state[i] >> 24 );
    }

    mbedtls_platform_zeroize( working_state, sizeof( working_state ) );
}